

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path_test.cpp
# Opt level: O3

void __thiscall
portability_path_test_portability_path_test_path_get_name_three_dots_Test::TestBody
          (portability_path_test_portability_path_test_path_get_name_three_dots_Test *this)

{
  undefined8 *puVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  string_name name;
  AssertHelper local_838;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_830;
  internal local_828 [8];
  undefined8 *local_820;
  byte local_818 [2048];
  
  pbVar2 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           portability_path_get_name("/a/b/c/...",0xb,local_818,0x800);
  local_830._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_830._M_head_impl._4_4_ << 0x20);
  local_838.data_._0_4_ = (uint)local_818[0];
  testing::internal::CmpHelperEQ<int,int>
            (local_828,"(int)0","(int)strcmp(name, result)",(int *)&local_830,(int *)&local_838);
  if (local_828[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_830);
    if (local_820 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_820;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_838,(Message *)&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_838);
    if (local_830._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_830._M_head_impl + 8))();
    }
  }
  puVar1 = local_820;
  if (local_820 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_820 != local_820 + 2) {
      operator_delete((undefined8 *)*local_820);
    }
    operator_delete(puVar1);
  }
  local_838.data_ = (AssertHelperData *)0x1;
  local_830._M_head_impl = pbVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_828,"(size_t)size","(size_t)sizeof(result)",(unsigned_long *)&local_830,
             (unsigned_long *)&local_838);
  if (local_828[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_830);
    if (local_820 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_820;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=(&local_838,(Message *)&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_838);
    if (local_830._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_830._M_head_impl + 8))();
    }
  }
  puVar1 = local_820;
  if (local_820 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_820 != local_820 + 2) {
      operator_delete((undefined8 *)*local_820);
    }
    operator_delete(puVar1);
  }
  local_830._M_head_impl = local_830._M_head_impl & 0xffffffffffffff00;
  local_838.data_ = local_838.data_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<char,char>
            (local_828,"(char)\'\\0\'","(char)result[size - 1]",(char *)&local_830,
             (char *)&local_838);
  if (local_828[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_830);
    if (local_820 == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (char *)*local_820;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_838,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/portability_path_test/source/portability_path_test.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=(&local_838,(Message *)&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_838);
    if (local_830._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_830._M_head_impl + 8))();
    }
  }
  if (local_820 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_820 != local_820 + 2) {
      operator_delete((undefined8 *)*local_820);
    }
    operator_delete(local_820);
  }
  return;
}

Assistant:

TEST_F(portability_path_test, portability_path_test_path_get_name_three_dots)
{
	static const char base[] = "/a/b/c/...";
	static const char result[] = "";

	string_name name;

	size_t size = portability_path_get_name(base, sizeof(base), name, NAME_SIZE);

	EXPECT_EQ((int)0, (int)strcmp(name, result));
	EXPECT_EQ((size_t)size, (size_t)sizeof(result));
	EXPECT_EQ((char)'\0', (char)result[size - 1]);
}